

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.cpp
# Opt level: O2

void __thiscall
glcts::GeometryShaderMaxCombinedTextureUnitsTest::prepareProgramInput
          (GeometryShaderMaxCombinedTextureUnitsTest *this)

{
  textureContainer *this_00;
  ostringstream *this_01;
  GLuint GVar1;
  code *pcVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  ulong uVar8;
  ostream *poVar9;
  TestError *this_02;
  long lVar10;
  int i;
  long lVar11;
  int i_1;
  undefined1 local_338 [384];
  stringstream stream;
  ostream local_1a8;
  long lVar7;
  
  iVar3 = (*((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.m_context)->
            m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  this_00 = &this->m_textures;
  std::
  vector<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
  ::resize(this_00,(long)this->m_n_texture_units);
  lVar10 = 4;
  for (lVar11 = 0; uVar8 = (ulong)this->m_n_texture_units, lVar11 < (long)uVar8; lVar11 = lVar11 + 1
      ) {
    *(int *)((long)&((this_00->
                     super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
                     )._M_impl.super__Vector_impl_data._M_start)->texture_id + lVar10) = (int)lVar11
    ;
    (**(code **)(lVar7 + 0x6f8))(1);
    (**(code **)(lVar7 + 0xb8))
              (0xde1,(this_00->
                     super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar11].texture_id);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"Failed to create texture",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0xc78);
    (**(code **)(lVar7 + 0x1310))
              (0xde1,0,0x8236,1,1,0,0x8d94,0x1405,
               (long)&((this_00->
                       super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
                       )._M_impl.super__Vector_impl_data._M_start)->texture_id + lVar10);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2600);
    (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
    dVar4 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar4,"Failed to create storage and fill texture with data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                    ,0xc81);
    lVar10 = lVar10 + 8;
  }
  iVar3 = 0;
  while( true ) {
    if ((int)uVar8 <= iVar3) {
      for (lVar10 = 0; lVar10 < (int)uVar8; lVar10 = lVar10 + 1) {
        (**(code **)(lVar7 + 8))((int)lVar10 + 0x84c0);
        (**(code **)(lVar7 + 0xb8))
                  (0xde1,(this->m_textures).
                         super__Vector_base<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data,_std::allocator<glcts::GeometryShaderMaxCombinedTextureUnitsTest::_texture_data>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar10].texture_id);
        (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2600);
        (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
        uVar8 = (ulong)(uint)this->m_n_texture_units;
      }
      dVar4 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar4,"Failed to set texture units up",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                      ,0xcaa);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&stream);
    poVar9 = std::operator<<(&local_1a8,"sampler[");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar3);
    std::operator<<(poVar9,"]");
    pcVar2 = *(code **)(lVar7 + 0xb48);
    GVar1 = (this->super_GeometryShaderLimitsRenderingBase).m_program_object_id;
    std::__cxx11::stringbuf::str();
    iVar5 = (*pcVar2)(GVar1,local_338._0_8_);
    std::__cxx11::string::~string((string *)local_338);
    if (iVar5 == -1) break;
    iVar6 = (**(code **)(lVar7 + 0x800))();
    if (iVar6 != 0) break;
    (**(code **)(lVar7 + 0x14f0))(iVar5,iVar3);
    iVar6 = (**(code **)(lVar7 + 0x800))();
    if (iVar6 != 0) {
      local_338._0_8_ =
           ((this->super_GeometryShaderLimitsRenderingBase).super_TestCaseBase.super_TestCase.
            super_TestNode.m_testCtx)->m_log;
      this_01 = (ostringstream *)(local_338 + 8);
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::operator<<((ostream *)this_01,"Failed to set uniform at location: ");
      std::ostream::operator<<(this_01,iVar5);
      std::operator<<((ostream *)this_01," to value: ");
      std::ostream::operator<<(this_01,iVar3);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_338,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_02,"Failed to get uniform isampler2D location",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
                 ,0xc9c);
      goto LAB_00cede34;
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    iVar3 = iVar3 + 1;
    uVar8 = (ulong)(uint)this->m_n_texture_units;
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,"Failed to get uniform usampler2D location",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLimits.cpp"
             ,0xc91);
LAB_00cede34:
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GeometryShaderMaxCombinedTextureUnitsTest::prepareProgramInput()
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_textures.resize(m_n_texture_units);

	/* Prepare texture storage and fill data */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		/* unique intensity equal to index of the texture */
		m_textures[i].data = i;

		/* Generate and bind texture */
		gl.genTextures(1, &m_textures[i].texture_id);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create texture");

		/* Allocate and upload texture data */
		gl.texImage2D(GL_TEXTURE_2D, 0 /* level */, GL_R32UI, 1 /* width*/, 1 /* height */, 0 /* border */,
					  GL_RED_INTEGER, GL_UNSIGNED_INT, &m_textures[i].data);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to create storage and fill texture with data");
	}

	/* Prepare sampler uniforms */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		/* Prepare name of sampler */
		std::stringstream stream;

		stream << "sampler[" << i << "]";

		/* Get sampler location */
		glw::GLint sampler_location = gl.getUniformLocation(m_program_object_id, stream.str().c_str());

		if (-1 == sampler_location || GL_NO_ERROR != gl.getError())
		{
			TCU_FAIL("Failed to get uniform usampler2D location");
		}

		/* Set uniform at sampler location value to index of texture unit */
		gl.uniform1i(sampler_location, i);

		if (GL_NO_ERROR != gl.getError())
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Failed to set uniform at location: " << sampler_location
							   << " to value: " << i << tcu::TestLog::EndMessage;

			TCU_FAIL("Failed to get uniform isampler2D location");
		}
	}

	/* Bind textures to texture units */
	for (int i = 0; i < m_n_texture_units; ++i)
	{
		gl.activeTexture(GL_TEXTURE0 + i);
		gl.bindTexture(GL_TEXTURE_2D, m_textures[i].texture_id);

		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set texture units up");
}